

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# having_binder.cpp
# Opt level: O2

BindResult * __thiscall
duckdb::HavingBinder::BindColumnRef
          (BindResult *__return_storage_ptr__,HavingBinder *this,
          unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
          *expr_ptr,idx_t depth,bool root_expression)

{
  BoundSelectNode *pBVar1;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> uVar2;
  bool bVar3;
  BaseExpression *pBVar4;
  ColumnRefExpression *pCVar5;
  string *psVar6;
  LambdaRefExpression *expr_00;
  string *psVar7;
  pointer pEVar8;
  BinderException *pBVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_250;
  Expression *local_248;
  LogicalType return_type;
  BindResult expr;
  string local_198;
  string local_178 [32];
  BindResult alias_result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  ColumnRefExpression col_ref;
  ColumnBinding column_binding;
  
  pBVar4 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
            ::operator->(expr_ptr)->super_BaseExpression;
  pCVar5 = BaseExpression::Cast<duckdb::ColumnRefExpression>(pBVar4);
  ColumnRefExpression::ColumnRefExpression(&col_ref,pCVar5);
  psVar6 = ColumnRefExpression::GetColumnName_abi_cxx11_(&col_ref);
  bVar3 = ColumnRefExpression::IsQualified(&col_ref);
  if (!bVar3) {
    ColumnRefExpression::GetName_abi_cxx11_((string *)&alias_result,&col_ref);
    LambdaRefExpression::FindMatchingBinding
              ((LambdaRefExpression *)&expr,
               &(this->super_BaseSelectBinder).super_ExpressionBinder.lambda_bindings,
               (string *)&alias_result);
    ::std::__cxx11::string::~string((string *)&alias_result);
    if (expr.expression.
        super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl !=
        (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>)
        0x0) {
      pBVar4 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                              *)&expr)->super_BaseExpression;
      expr_00 = BaseExpression::Cast<duckdb::LambdaRefExpression>(pBVar4);
      BindLambdaReference(__return_storage_ptr__,this,expr_00,depth);
      if (expr.expression.
          super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
          super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
          super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
          super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl !=
          (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>)
          0x0) {
        (**(code **)(*(long *)expr.expression.
                              super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                              ._M_t.
                              super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                              .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl + 8))
                  ();
      }
      goto LAB_01633a4d;
    }
    psVar7 = ColumnRefExpression::GetColumnName_abi_cxx11_(&col_ref);
    (*(this->super_BaseSelectBinder).super_ExpressionBinder._vptr_ExpressionBinder[6])
              (&alias_result,this,psVar7);
    uVar2 = alias_result.expression;
    if ((alias_result.expression.
         super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
         super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl !=
         (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>)
         0x0) && ((*(this->super_BaseSelectBinder).super_ExpressionBinder._vptr_ExpressionBinder[5])
                            (__return_storage_ptr__,this,&alias_result,depth,0),
                 alias_result.expression.
                 super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
                 .
                 super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                 .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl !=
                 (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>
                  )0x0)) {
      (**(code **)(*(long *)alias_result.expression.
                            super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                            ._M_t.
                            super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                            .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl + 8))()
      ;
    }
    if (expr.expression.
        super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl !=
        (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>)
        0x0) {
      (**(code **)(*(long *)expr.expression.
                            super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                            ._M_t.
                            super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                            .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl + 8))()
      ;
    }
    if (uVar2.super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl !=
        (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>)
        0x0) goto LAB_01633a4d;
  }
  BindResult::BindResult(&alias_result);
  params = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)depth;
  bVar3 = ColumnAliasBinder::BindAlias
                    (&this->column_alias_binder,(ExpressionBinder *)this,expr_ptr,depth,
                     root_expression,&alias_result);
  if (bVar3) {
    if (depth != 0) {
      pBVar9 = (BinderException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&expr,
                 "Having clause cannot reference alias \"%s\" in correlated subquery",
                 (allocator *)&return_type);
      ::std::__cxx11::string::string((string *)&local_b0,(string *)psVar6);
      BinderException::BinderException<std::__cxx11::string>(pBVar9,(string *)&expr,&local_b0);
      __cxa_throw(pBVar9,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    BindResult::BindResult(__return_storage_ptr__,&alias_result);
  }
  else if (this->aggregate_handling == FORCE_AGGREGATES) {
    if (depth != 0) {
      pBVar9 = (BinderException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&expr,
                 "Having clause cannot reference column \"%s\" in correlated subquery and group by all"
                 ,(allocator *)&return_type);
      ::std::__cxx11::string::string((string *)&local_d0,(string *)psVar6);
      BinderException::BinderException<std::__cxx11::string>(pBVar9,(string *)&expr,&local_d0);
      __cxa_throw(pBVar9,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    ExpressionBinder::BindExpression(&expr,(ExpressionBinder *)this,expr_ptr,0,false);
    if (expr.error.initialized == true) {
      BindResult::BindResult(__return_storage_ptr__,&expr);
    }
    else {
      pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(&expr.expression);
      LogicalType::LogicalType(&return_type,&pEVar8->return_type);
      pBVar1 = (this->super_BaseSelectBinder).node;
      column_binding.table_index = pBVar1->group_index;
      column_binding.column_index =
           (long)(pBVar1->groups).group_expressions.
                 super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(pBVar1->groups).group_expressions.
                 super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3;
      make_uniq<duckdb::BoundColumnRefExpression,duckdb::LogicalType&,duckdb::ColumnBinding&>
                ((duckdb *)&local_248,&return_type,&column_binding);
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)&((this->super_BaseSelectBinder).node)->groups,&expr.expression);
      local_250._M_head_impl = local_248;
      local_248 = (Expression *)0x0;
      BindResult::BindResult
                (__return_storage_ptr__,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &local_250);
      if (local_250._M_head_impl != (Expression *)0x0) {
        (*((local_250._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
      local_250._M_head_impl = (Expression *)0x0;
      if (local_248 != (Expression *)0x0) {
        (*(local_248->super_BaseExpression)._vptr_BaseExpression[1])();
      }
      LogicalType::~LogicalType(&return_type);
    }
    BindResult::~BindResult(&expr);
  }
  else {
    ::std::__cxx11::string::string
              (local_178,
               "column %s must appear in the GROUP BY clause or be used in an aggregate function",
               (allocator *)&return_type);
    ::std::__cxx11::string::string((string *)&local_198,(string *)psVar6);
    StringUtil::Format<std::__cxx11::string>
              ((string *)&expr,(StringUtil *)local_178,&local_198,params);
    BindResult::BindResult(__return_storage_ptr__,(string *)&expr);
    ::std::__cxx11::string::~string((string *)&expr);
    ::std::__cxx11::string::~string((string *)&local_198);
    ::std::__cxx11::string::~string(local_178);
  }
  BindResult::~BindResult(&alias_result);
LAB_01633a4d:
  ColumnRefExpression::~ColumnRefExpression(&col_ref);
  return __return_storage_ptr__;
}

Assistant:

BindResult HavingBinder::BindColumnRef(unique_ptr<ParsedExpression> &expr_ptr, idx_t depth, bool root_expression) {

	// Keep the original column name to return a meaningful error message.
	auto col_ref = expr_ptr->Cast<ColumnRefExpression>();
	const auto &column_name = col_ref.GetColumnName();

	// Try binding as a lambda parameter
	if (!col_ref.IsQualified()) {
		auto lambda_ref = LambdaRefExpression::FindMatchingBinding(lambda_bindings, col_ref.GetName());
		if (lambda_ref) {
			return BindLambdaReference(lambda_ref->Cast<LambdaRefExpression>(), depth);
		}
		// column was not found - check if it is a SQL value function
		auto value_function = GetSQLValueFunction(col_ref.GetColumnName());
		if (value_function) {
			return BindExpression(value_function, depth);
		}
	}

	// Bind the alias.
	BindResult alias_result;
	auto found_alias = column_alias_binder.BindAlias(*this, expr_ptr, depth, root_expression, alias_result);
	if (found_alias) {
		if (depth > 0) {
			throw BinderException("Having clause cannot reference alias \"%s\" in correlated subquery", column_name);
		}
		return alias_result;
	}

	if (aggregate_handling != AggregateHandling::FORCE_AGGREGATES) {
		return BindResult(StringUtil::Format(
		    "column %s must appear in the GROUP BY clause or be used in an aggregate function", column_name));
	}

	if (depth > 0) {
		throw BinderException("Having clause cannot reference column \"%s\" in correlated subquery and group by all",
		                      column_name);
	}

	auto expr = duckdb::BaseSelectBinder::BindColumnRef(expr_ptr, depth, root_expression);
	if (expr.HasError()) {
		return expr;
	}

	// Return a GROUP BY column reference expression.
	auto return_type = expr.expression->return_type;
	auto column_binding = ColumnBinding(node.group_index, node.groups.group_expressions.size());
	auto group_ref = make_uniq<BoundColumnRefExpression>(return_type, column_binding);
	node.groups.group_expressions.push_back(std::move(expr.expression));
	return BindResult(std::move(group_ref));
}